

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_init(char *cfg)

{
  char **groupptr;
  size_t *grouplen_00;
  size_t sVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  fsnav_imu *imu;
  fsnav_gnss *pfVar5;
  size_t sVar6;
  fsnav_air *air;
  fsnav_ref *ref;
  fsnav_struct *pfVar7;
  char *cfgptr;
  size_t grouplen;
  char multi_gnss_token [9];
  
  pfVar7 = fsnav;
  builtin_strncpy(multi_gnss_token,"gnss[0]:",9);
  sVar1 = 0;
  do {
    sVar6 = sVar1;
    pfVar7->cfglength = sVar6;
    sVar1 = sVar6 + 1;
  } while (cfg[sVar6] != '\0');
  pcVar3 = (char *)malloc(sVar6 + 1);
  pfVar7->cfg = pcVar3;
  if (pcVar3 == (char *)0x0) {
    return '\0';
  }
  for (uVar4 = 0; uVar4 < sVar6; uVar4 = uVar4 + 1) {
    pfVar7->cfg[uVar4] = cfg[uVar4];
    sVar6 = fsnav->cfglength;
    pfVar7 = fsnav;
  }
  pfVar7->cfg[sVar6] = '\0';
  pfVar7 = fsnav;
  groupptr = &fsnav->cfg_settings;
  grouplen_00 = &fsnav->settings_length;
  fsnav->cfg_settings = (char *)0x0;
  pfVar7->settings_length = 0;
  fsnav_locatecfggroup("",pfVar7->cfg,pfVar7->cfglength,groupptr,grouplen_00);
  fsnav_init_imu_const();
  pfVar7 = fsnav;
  fsnav->imu = (fsnav_imu *)0x0;
  cVar2 = fsnav_locatecfggroup("imu:",pfVar7->cfg,pfVar7->cfglength,&cfgptr,&grouplen);
  if (cVar2 != '\0') {
    imu = (fsnav_imu *)calloc(1,0x200);
    fsnav->imu = imu;
    if (imu == (fsnav_imu *)0x0) goto LAB_00106eea;
    imu->cfg = cfgptr;
    imu->cfglength = grouplen;
    cVar2 = fsnav_init_imu(imu);
    if (cVar2 == '\0') goto LAB_00106eea;
  }
  fsnav_init_gnss_const();
  pfVar7 = fsnav;
  fsnav->gnss = (fsnav_gnss *)0x0;
  pfVar7->gnss_count = 0;
  for (uVar4 = 0; pfVar7 = fsnav, uVar4 != 10; uVar4 = uVar4 + 1) {
    multi_gnss_token._0_8_ =
         CONCAT26(multi_gnss_token._6_2_,CONCAT15((char)uVar4,multi_gnss_token._0_5_)) |
         0x300000000000;
    if (((uVar4 == 0) &&
        (cVar2 = fsnav_locatecfggroup("gnss:",fsnav->cfg,fsnav->cfglength,&cfgptr,&grouplen),
        cVar2 != '\0')) ||
       (cVar2 = fsnav_locatecfggroup(multi_gnss_token,fsnav->cfg,fsnav->cfglength,&cfgptr,&grouplen)
       , cVar2 != '\0')) {
      pfVar7 = fsnav;
      if (fsnav->gnss_count <= uVar4) {
        pfVar5 = (fsnav_gnss *)realloc(fsnav->gnss,(uVar4 + 1) * 0x1d8);
        pfVar7 = fsnav;
        if (pfVar5 == (fsnav_gnss *)0x0) goto LAB_00106eea;
        fsnav->gnss = pfVar5;
        sVar6 = pfVar7->gnss_count;
        while (sVar6 < uVar4) {
          pfVar7->gnss[sVar6].cfg = (char *)0x0;
          pfVar5 = fsnav->gnss;
          sVar6 = fsnav->gnss_count;
          pfVar5[sVar6].cfglength = 0;
          fsnav_init_gnss(pfVar5 + sVar6);
          pfVar7 = fsnav;
          sVar6 = fsnav->gnss_count + 1;
          fsnav->gnss_count = sVar6;
        }
        pfVar7->gnss_count = uVar4 + 1;
      }
      pfVar7->gnss[uVar4].cfg = cfgptr;
      pfVar5 = fsnav->gnss;
      pfVar5[uVar4].cfglength = grouplen;
      cVar2 = fsnav_init_gnss(pfVar5 + uVar4);
      if (cVar2 == '\0') goto LAB_00106eea;
    }
  }
  fsnav->air = (fsnav_air *)0x0;
  cVar2 = fsnav_locatecfggroup("air:",pfVar7->cfg,pfVar7->cfglength,&cfgptr,&grouplen);
  pfVar7 = fsnav;
  if (cVar2 != '\0') {
    air = (fsnav_air *)calloc(1,0x60);
    pfVar7->air = air;
    if (air == (fsnav_air *)0x0) goto LAB_00106eea;
    air->cfg = cfgptr;
    air->cfglength = grouplen;
    fsnav_init_air(air);
  }
  pfVar7->ref = (fsnav_ref *)0x0;
  cVar2 = fsnav_locatecfggroup("ref:",pfVar7->cfg,pfVar7->cfglength,&cfgptr,&grouplen);
  if (cVar2 != '\0') {
    ref = (fsnav_ref *)calloc(1,0x160);
    fsnav->ref = ref;
    if (ref == (fsnav_ref *)0x0) goto LAB_00106eea;
    ref->cfg = cfgptr;
    ref->cfglength = grouplen;
    cVar2 = fsnav_init_ref(ref);
    if (cVar2 == '\0') goto LAB_00106eea;
  }
  cVar2 = fsnav_init_sol(&fsnav->sol,fsnav->cfg_settings,fsnav->settings_length);
  pfVar7 = fsnav;
  if (cVar2 != '\0') {
    fsnav->t = 0.0;
    pfVar7->mode = 0;
    return '\x01';
  }
LAB_00106eea:
  fsnav_free();
  return '\0';
}

Assistant:

char fsnav_init(char* cfg)
{
	const size_t max_gnss_count = 10; // maximum number of gnss receiver data structures

	char multi_gnss_token[] = "gnss[0]:";
	const size_t multi_gnss_index_position = 5;

	size_t grouplen;
	char* cfgptr;

	fsnav_gnss* reallocated_pointer;

	size_t i;

	// determine configuration string length
	for (fsnav->cfglength = 0; cfg[fsnav->cfglength]; fsnav->cfglength++);

	// assign configuration string
	fsnav->cfg = (char*)malloc(sizeof(char)*(fsnav->cfglength+1));
	if (fsnav->cfg == NULL)
		return 0;
	for (i = 0; i < fsnav->cfglength; i++)
		fsnav->cfg[i] = cfg[i];
	fsnav->cfg[fsnav->cfglength] = '\0';

	// fetch a part of configuration that is outside of any group
	fsnav->cfg_settings = NULL;
	fsnav->settings_length = 0;
	fsnav_locatecfggroup("", fsnav->cfg, fsnav->cfglength, &fsnav->cfg_settings, &fsnav->settings_length);

	// imu init
	fsnav_init_imu_const();
	fsnav->imu = NULL;
	if (fsnav_locatecfggroup("imu:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try to allocate memory
		fsnav->imu = (fsnav_imu*)calloc(1, sizeof(fsnav_imu));
		if (fsnav->imu == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->imu->cfg = cfgptr;
		fsnav->imu->cfglength = grouplen;

		// try to init
		if (!fsnav_init_imu(fsnav->imu)) {
			fsnav_free();
			return 0;
		}
	}

	// gnss init
	fsnav_init_gnss_const();
	fsnav->gnss = NULL;
	fsnav->gnss_count = 0;
	// multiple gnss mode support
	for (i = 0; i < max_gnss_count; i++) {
		multi_gnss_token[multi_gnss_index_position] = '0' + (char)i;

		if ((i == 0 && fsnav_locatecfggroup("gnss:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) ||
		     fsnav_locatecfggroup(multi_gnss_token, fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) {
			if (i >= fsnav->gnss_count) {
				// try to allocate/reallocate memory
				reallocated_pointer = (fsnav_gnss*)realloc(fsnav->gnss, sizeof(fsnav_gnss)*(i+1));
				if (reallocated_pointer == NULL) {
					fsnav_free();
					return 0;
				}
				else
					fsnav->gnss = reallocated_pointer;
				// try to init new instances, except the i-th one
				for (; fsnav->gnss_count < i; fsnav->gnss_count++) {
					fsnav->gnss[fsnav->gnss_count].cfg = NULL;
					fsnav->gnss[fsnav->gnss_count].cfglength = 0;
					fsnav_init_gnss(&(fsnav->gnss[fsnav->gnss_count]));
				}
				fsnav->gnss_count = i+1;
			}

			// set configuration pointer
			fsnav->gnss[i].cfg = cfgptr;
			fsnav->gnss[i].cfglength = grouplen;

			// try to init
			if (!fsnav_init_gnss(&(fsnav->gnss[i]))) {
				fsnav_free();
				return 0;
			}
		}
	}

	// air data init
	fsnav->air = NULL;
	if (fsnav_locatecfggroup("air:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try to allocate memory
		fsnav->air = (fsnav_air*)calloc(1, sizeof(fsnav_air));
		if (fsnav->air == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->air->cfg = cfgptr;
		fsnav->air->cfglength = grouplen;

		// try to init
		if (!fsnav_init_air(fsnav->air)) {
			fsnav_free();
			return 0;
		}
	}

	// reference data init
	fsnav->ref = NULL;
	if (fsnav_locatecfggroup("ref:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try lo allocate memory
		fsnav->ref = (fsnav_ref*)calloc(1, sizeof(fsnav_ref));
		if (fsnav->ref == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->ref->cfg = cfgptr;
		fsnav->ref->cfglength = grouplen;

		// try to init
		if(!fsnav_init_ref(fsnav->ref)) {
			fsnav_free();
			return 0;
		}
	}

	// solution
	if (!fsnav_init_sol(&(fsnav->sol), fsnav->cfg_settings, fsnav->settings_length)) {
		fsnav_free();
		return 0;
	}

	// system time, operation mode
	fsnav->t = 0;
	fsnav->mode = 0;
	return 1;
}